

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_sse2.c
# Opt level: O1

void av1_calc_indices_dim1_sse2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  longlong *plVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  long lVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar17 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  short asStack_88 [2];
  undefined4 uStack_84;
  __m128i cents [8];
  
  if (0 < k) {
    lVar3 = 0;
    do {
      auVar6 = pshuflw(ZEXT216(*(ushort *)((long)centroids + lVar3)),
                       ZEXT216(*(ushort *)((long)centroids + lVar3)),0);
      uVar5 = auVar6._0_4_;
      *(undefined4 *)(asStack_88 + lVar3 * 4) = uVar5;
      *(undefined4 *)((long)cents[-1] + lVar3 * 8 + 0xc) = uVar5;
      *(undefined4 *)(cents[0] + lVar3) = uVar5;
      *(undefined4 *)((long)cents[0] + lVar3 * 8 + 4) = uVar5;
      lVar3 = lVar3 + 2;
    } while ((ulong)(uint)k * 2 != lVar3);
  }
  if (n < 1) {
    lVar3 = 0;
    lVar7 = 0;
  }
  else {
    iVar2 = 0;
    lVar3 = 0;
    lVar7 = 0;
    do {
      sVar16 = *data - asStack_88[0];
      sVar18 = data[1] - asStack_88[1];
      sVar19 = data[2] - (short)uStack_84;
      sVar20 = data[3] - uStack_84._2_2_;
      sVar21 = data[4] - (short)cents[0][0];
      sVar22 = data[5] - cents[0][0]._2_2_;
      sVar23 = data[6] - cents[0][0]._4_2_;
      sVar24 = data[7] - cents[0][0]._6_2_;
      sVar8 = -sVar16;
      sVar9 = -sVar18;
      sVar10 = -sVar19;
      sVar11 = -sVar20;
      sVar12 = -sVar21;
      sVar13 = -sVar22;
      sVar14 = -sVar23;
      sVar15 = -sVar24;
      auVar6._0_2_ = (ushort)(sVar8 < sVar16) * sVar16 | (ushort)(sVar8 >= sVar16) * sVar8;
      auVar6._2_2_ = (ushort)(sVar9 < sVar18) * sVar18 | (ushort)(sVar9 >= sVar18) * sVar9;
      auVar6._4_2_ = (ushort)(sVar10 < sVar19) * sVar19 | (ushort)(sVar10 >= sVar19) * sVar10;
      auVar6._6_2_ = (ushort)(sVar11 < sVar20) * sVar20 | (ushort)(sVar11 >= sVar20) * sVar11;
      auVar6._8_2_ = (ushort)(sVar12 < sVar21) * sVar21 | (ushort)(sVar12 >= sVar21) * sVar12;
      auVar6._10_2_ = (ushort)(sVar13 < sVar22) * sVar22 | (ushort)(sVar13 >= sVar22) * sVar13;
      auVar6._12_2_ = (ushort)(sVar14 < sVar23) * sVar23 | (ushort)(sVar14 >= sVar23) * sVar14;
      auVar6._14_2_ = (ushort)(sVar15 < sVar24) * sVar24 | (ushort)(sVar15 >= sVar24) * sVar15;
      auVar17 = (undefined1  [16])0x0;
      if (1 < k) {
        uVar4 = 1;
        plVar1 = cents[0] + 1;
        auVar25 = auVar6;
        do {
          sVar16 = *data - (short)*plVar1;
          sVar18 = data[1] - *(short *)((long)plVar1 + 2);
          sVar19 = data[2] - *(short *)((long)plVar1 + 4);
          sVar20 = data[3] - *(short *)((long)plVar1 + 6);
          sVar21 = data[4] - *(short *)(plVar1 + 1);
          sVar22 = data[5] - *(short *)((long)plVar1 + 10);
          sVar23 = data[6] - *(short *)((long)plVar1 + 0xc);
          sVar24 = data[7] - *(short *)((long)plVar1 + 0xe);
          sVar8 = -sVar16;
          sVar9 = -sVar18;
          sVar10 = -sVar19;
          sVar11 = -sVar20;
          sVar12 = -sVar21;
          sVar13 = -sVar22;
          sVar14 = -sVar23;
          sVar15 = -sVar24;
          uVar27 = (ushort)(sVar8 < sVar16) * sVar16 | (ushort)(sVar8 >= sVar16) * sVar8;
          uVar28 = (ushort)(sVar9 < sVar18) * sVar18 | (ushort)(sVar9 >= sVar18) * sVar9;
          uVar29 = (ushort)(sVar10 < sVar19) * sVar19 | (ushort)(sVar10 >= sVar19) * sVar10;
          uVar30 = (ushort)(sVar11 < sVar20) * sVar20 | (ushort)(sVar11 >= sVar20) * sVar11;
          uVar31 = (ushort)(sVar12 < sVar21) * sVar21 | (ushort)(sVar12 >= sVar21) * sVar12;
          uVar32 = (ushort)(sVar13 < sVar22) * sVar22 | (ushort)(sVar13 >= sVar22) * sVar13;
          uVar33 = (ushort)(sVar14 < sVar23) * sVar23 | (ushort)(sVar14 >= sVar23) * sVar14;
          uVar34 = (ushort)(sVar15 < sVar24) * sVar24 | (ushort)(sVar15 >= sVar24) * sVar15;
          sVar8 = auVar25._0_2_;
          auVar6._0_2_ = ((short)uVar27 < sVar8) * uVar27 | (ushort)((short)uVar27 >= sVar8) * sVar8
          ;
          sVar9 = auVar25._2_2_;
          auVar6._2_2_ = ((short)uVar28 < sVar9) * uVar28 | (ushort)((short)uVar28 >= sVar9) * sVar9
          ;
          sVar10 = auVar25._4_2_;
          auVar6._4_2_ = ((short)uVar29 < sVar10) * uVar29 |
                         (ushort)((short)uVar29 >= sVar10) * sVar10;
          sVar11 = auVar25._6_2_;
          auVar6._6_2_ = ((short)uVar30 < sVar11) * uVar30 |
                         (ushort)((short)uVar30 >= sVar11) * sVar11;
          sVar12 = auVar25._8_2_;
          auVar6._8_2_ = ((short)uVar31 < sVar12) * uVar31 |
                         (ushort)((short)uVar31 >= sVar12) * sVar12;
          sVar13 = auVar25._10_2_;
          auVar6._10_2_ =
               ((short)uVar32 < sVar13) * uVar32 | (ushort)((short)uVar32 >= sVar13) * sVar13;
          sVar14 = auVar25._12_2_;
          sVar15 = auVar25._14_2_;
          auVar6._12_2_ =
               ((short)uVar33 < sVar14) * uVar33 | (ushort)((short)uVar33 >= sVar14) * sVar14;
          auVar6._14_2_ =
               ((short)uVar34 < sVar15) * uVar34 | (ushort)((short)uVar34 >= sVar15) * sVar15;
          auVar25 = pshuflw(ZEXT416((uint)uVar4),ZEXT416((uint)uVar4),0);
          auVar26._0_4_ = auVar25._0_4_;
          auVar26._4_4_ = auVar26._0_4_;
          auVar26._8_4_ = auVar26._0_4_;
          auVar26._12_4_ = auVar26._0_4_;
          auVar25._0_2_ = -(ushort)((short)uVar27 < sVar8);
          auVar25._2_2_ = -(ushort)((short)uVar28 < sVar9);
          auVar25._4_2_ = -(ushort)((short)uVar29 < sVar10);
          auVar25._6_2_ = -(ushort)((short)uVar30 < sVar11);
          auVar25._8_2_ = -(ushort)((short)uVar31 < sVar12);
          auVar25._10_2_ = -(ushort)((short)uVar32 < sVar13);
          auVar25._12_2_ = -(ushort)((short)uVar33 < sVar14);
          auVar25._14_2_ = -(ushort)((short)uVar34 < sVar15);
          auVar17 = auVar25 & auVar26 | ~auVar25 & auVar17;
          uVar4 = uVar4 + 1;
          plVar1 = plVar1 + 2;
          auVar25 = auVar6;
        } while ((uint)k != uVar4);
      }
      if (total_dist != (int64_t *)0x0) {
        auVar6 = pmaddwd(auVar6,auVar6);
        lVar3 = lVar3 + (auVar6._0_8_ & 0xffffffff) + (ulong)auVar6._8_4_;
        lVar7 = lVar7 + (ulong)auVar6._4_4_ + (ulong)auVar6._12_4_;
      }
      sVar8 = auVar17._0_2_;
      sVar9 = auVar17._2_2_;
      sVar10 = auVar17._4_2_;
      sVar11 = auVar17._6_2_;
      sVar12 = auVar17._8_2_;
      sVar13 = auVar17._10_2_;
      sVar14 = auVar17._12_2_;
      sVar15 = auVar17._14_2_;
      *(ulong *)indices =
           CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar17[0xe] - (0xff < sVar15),
                    CONCAT16((0 < sVar14) * (sVar14 < 0x100) * auVar17[0xc] - (0xff < sVar14),
                             CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar17[10] -
                                      (0xff < sVar13),
                                      CONCAT14((0 < sVar12) * (sVar12 < 0x100) * auVar17[8] -
                                               (0xff < sVar12),
                                               CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar17[6]
                                                        - (0xff < sVar11),
                                                        CONCAT12((0 < sVar10) * (sVar10 < 0x100) *
                                                                 auVar17[4] - (0xff < sVar10),
                                                                 CONCAT11((0 < sVar9) *
                                                                          (sVar9 < 0x100) *
                                                                          auVar17[2] -
                                                                          (0xff < sVar9),
                                                                          (0 < sVar8) *
                                                                          (sVar8 < 0x100) *
                                                                          auVar17[0] -
                                                                          (0xff < sVar8))))))));
      indices = indices + 8;
      data = data + 8;
      iVar2 = iVar2 + 8;
    } while (iVar2 < n);
  }
  if (total_dist != (int64_t *)0x0) {
    *total_dist = lVar7 + lVar3;
  }
  return;
}

Assistant:

void av1_calc_indices_dim1_sse2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m128i v_zero = _mm_setzero_si128();
  __m128i sum = _mm_setzero_si128();
  __m128i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    cents[j] = _mm_set1_epi16(centroids[j]);
  }

  for (int i = 0; i < n; i += 8) {
    const __m128i in = _mm_loadu_si128((__m128i *)data);
    __m128i ind = _mm_setzero_si128();
    // Compute the distance to the first centroid.
    __m128i d1 = _mm_sub_epi16(in, cents[0]);
    __m128i d2 = _mm_sub_epi16(cents[0], in);
    __m128i dist_min = _mm_max_epi16(d1, d2);

    for (int j = 1; j < k; ++j) {
      // Compute the distance to the centroid.
      d1 = _mm_sub_epi16(in, cents[j]);
      d2 = _mm_sub_epi16(cents[j], in);
      const __m128i dist = _mm_max_epi16(d1, d2);
      // Compare to the minimal one.
      const __m128i cmp = _mm_cmpgt_epi16(dist_min, dist);
      dist_min = _mm_min_epi16(dist_min, dist);
      const __m128i ind1 = _mm_set1_epi16(j);
      ind = _mm_or_si128(_mm_andnot_si128(cmp, ind), _mm_and_si128(cmp, ind1));
    }
    if (total_dist) {
      // Square, convert to 32 bit and add together.
      dist_min = _mm_madd_epi16(dist_min, dist_min);
      // Convert to 64 bit and add to sum.
      const __m128i dist1 = _mm_unpacklo_epi32(dist_min, v_zero);
      const __m128i dist2 = _mm_unpackhi_epi32(dist_min, v_zero);
      sum = _mm_add_epi64(sum, dist1);
      sum = _mm_add_epi64(sum, dist2);
    }
    __m128i p2 = _mm_packus_epi16(ind, v_zero);
    _mm_storel_epi64((__m128i *)indices, p2);
    indices += 8;
    data += 8;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_sse2(sum);
  }
}